

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

Time __thiscall libwebvtt::Time::operator+(Time *this,presentation_t d)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  Time TVar7;
  
  lVar1._0_4_ = this->hours;
  lVar1._4_4_ = this->minutes;
  lVar2._0_4_ = this->seconds;
  lVar2._4_4_ = this->milliseconds;
  uVar4 = (lVar2 >> 0x20) + d + (lVar1 >> 0x20) * 60000 + (long)(int)(undefined4)lVar1 * 3600000 +
          (long)(int)(undefined4)lVar2 * 1000;
  if ((long)uVar4 < 0) {
    uVar5 = 0;
    uVar3 = 0;
  }
  else {
    iVar6 = (int)(uVar4 / 1000);
    uVar5 = CONCAT44((int)uVar4 - (int)((uVar4 / 1000) * 0x3e800000000 >> 0x20),iVar6 % 0x3c);
    uVar3 = CONCAT44((iVar6 / 0xe10) * -0x3c + iVar6 / 0x3c,iVar6 / 0xe10);
  }
  TVar7.seconds = (int)uVar5;
  TVar7.milliseconds = (int)((ulong)uVar5 >> 0x20);
  TVar7.hours = (int)uVar3;
  TVar7.minutes = (int)((ulong)uVar3 >> 0x20);
  return TVar7;
}

Assistant:

Time Time::operator+(presentation_t d) const {
  Time t(*this);
  t += d;
  return t;
}